

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O1

ogt_vox_transform *
ogt_vox_transform_multiply
          (ogt_vox_transform *__return_storage_ptr__,ogt_vox_transform *a,ogt_vox_transform *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  fVar1 = a->m00;
  fVar2 = a->m01;
  fVar3 = b->m00;
  fVar4 = b->m10;
  fVar5 = a->m02;
  fVar6 = b->m20;
  fVar7 = a->m03;
  fVar8 = b->m30;
  __return_storage_ptr__->m00 = fVar7 * fVar8 + fVar5 * fVar6 + fVar1 * fVar3 + fVar2 * fVar4;
  fVar9 = b->m01;
  fVar10 = b->m11;
  fVar11 = b->m21;
  fVar12 = b->m31;
  __return_storage_ptr__->m01 = fVar7 * fVar12 + fVar5 * fVar11 + fVar1 * fVar9 + fVar2 * fVar10;
  fVar13 = b->m02;
  fVar14 = b->m12;
  fVar15 = b->m22;
  fVar16 = b->m32;
  __return_storage_ptr__->m02 = fVar7 * fVar16 + fVar5 * fVar15 + fVar1 * fVar13 + fVar2 * fVar14;
  fVar17 = b->m13;
  fVar18 = b->m03;
  fVar19 = b->m23;
  fVar20 = b->m33;
  __return_storage_ptr__->m03 = fVar7 * fVar20 + fVar5 * fVar19 + fVar1 * fVar18 + fVar2 * fVar17;
  fVar1 = a->m11;
  fVar2 = a->m10;
  fVar5 = a->m12;
  fVar7 = a->m13;
  __return_storage_ptr__->m10 = fVar7 * fVar8 + fVar5 * fVar6 + fVar2 * fVar3 + fVar4 * fVar1;
  __return_storage_ptr__->m11 = fVar7 * fVar12 + fVar5 * fVar11 + fVar2 * fVar9 + fVar10 * fVar1;
  __return_storage_ptr__->m12 = fVar7 * fVar16 + fVar5 * fVar15 + fVar2 * fVar13 + fVar14 * fVar1;
  __return_storage_ptr__->m13 = fVar7 * fVar20 + fVar5 * fVar19 + fVar2 * fVar18 + fVar1 * fVar17;
  fVar1 = a->m21;
  fVar2 = a->m20;
  fVar5 = a->m22;
  fVar7 = a->m23;
  __return_storage_ptr__->m20 = fVar7 * fVar8 + fVar5 * fVar6 + fVar2 * fVar3 + fVar4 * fVar1;
  __return_storage_ptr__->m21 = fVar7 * fVar12 + fVar5 * fVar11 + fVar2 * fVar9 + fVar10 * fVar1;
  __return_storage_ptr__->m22 = fVar7 * fVar16 + fVar5 * fVar15 + fVar2 * fVar13 + fVar14 * fVar1;
  __return_storage_ptr__->m23 = fVar7 * fVar20 + fVar5 * fVar19 + fVar2 * fVar18 + fVar1 * fVar17;
  fVar1 = a->m31;
  fVar2 = a->m30;
  fVar5 = a->m32;
  fVar7 = a->m33;
  __return_storage_ptr__->m30 = fVar8 * fVar7 + fVar6 * fVar5 + fVar3 * fVar2 + fVar4 * fVar1;
  __return_storage_ptr__->m31 = fVar12 * fVar7 + fVar11 * fVar5 + fVar9 * fVar2 + fVar10 * fVar1;
  __return_storage_ptr__->m32 = fVar16 * fVar7 + fVar15 * fVar5 + fVar13 * fVar2 + fVar14 * fVar1;
  __return_storage_ptr__->m33 = fVar7 * fVar20 + fVar5 * fVar19 + fVar2 * fVar18 + fVar17 * fVar1;
  return __return_storage_ptr__;
}

Assistant:

ogt_vox_transform ogt_vox_transform_multiply(const ogt_vox_transform& a, const ogt_vox_transform& b) {
        ogt_vox_transform r;
        r.m00 = (a.m00 * b.m00) + (a.m01 * b.m10) + (a.m02 * b.m20) + (a.m03 * b.m30);
        r.m01 = (a.m00 * b.m01) + (a.m01 * b.m11) + (a.m02 * b.m21) + (a.m03 * b.m31);
        r.m02 = (a.m00 * b.m02) + (a.m01 * b.m12) + (a.m02 * b.m22) + (a.m03 * b.m32);
        r.m03 = (a.m00 * b.m03) + (a.m01 * b.m13) + (a.m02 * b.m23) + (a.m03 * b.m33);
        r.m10 = (a.m10 * b.m00) + (a.m11 * b.m10) + (a.m12 * b.m20) + (a.m13 * b.m30);
        r.m11 = (a.m10 * b.m01) + (a.m11 * b.m11) + (a.m12 * b.m21) + (a.m13 * b.m31);
        r.m12 = (a.m10 * b.m02) + (a.m11 * b.m12) + (a.m12 * b.m22) + (a.m13 * b.m32);
        r.m13 = (a.m10 * b.m03) + (a.m11 * b.m13) + (a.m12 * b.m23) + (a.m13 * b.m33);
        r.m20 = (a.m20 * b.m00) + (a.m21 * b.m10) + (a.m22 * b.m20) + (a.m23 * b.m30);
        r.m21 = (a.m20 * b.m01) + (a.m21 * b.m11) + (a.m22 * b.m21) + (a.m23 * b.m31);
        r.m22 = (a.m20 * b.m02) + (a.m21 * b.m12) + (a.m22 * b.m22) + (a.m23 * b.m32);
        r.m23 = (a.m20 * b.m03) + (a.m21 * b.m13) + (a.m22 * b.m23) + (a.m23 * b.m33);
        r.m30 = (a.m30 * b.m00) + (a.m31 * b.m10) + (a.m32 * b.m20) + (a.m33 * b.m30);
        r.m31 = (a.m30 * b.m01) + (a.m31 * b.m11) + (a.m32 * b.m21) + (a.m33 * b.m31);
        r.m32 = (a.m30 * b.m02) + (a.m31 * b.m12) + (a.m32 * b.m22) + (a.m33 * b.m32);
        r.m33 = (a.m30 * b.m03) + (a.m31 * b.m13) + (a.m32 * b.m23) + (a.m33 * b.m33);
        return r;
    }